

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O3

bool check_for_option(int argc,char **argv,char *pOption)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  
  if (argc < 2) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    uVar2 = 2;
    do {
      if (((byte)(*argv[uVar2 - 1] | 2U) == 0x2f) &&
         (iVar1 = crnlib::crn_stricmp(argv[uVar2 - 1] + 1,pOption), iVar1 == 0)) {
        return bVar3;
      }
      bVar3 = uVar2 < (uint)argc;
      bVar4 = uVar2 != (uint)argc;
      uVar2 = uVar2 + 1;
    } while (bVar4);
  }
  return bVar3;
}

Assistant:

static bool check_for_option(int argc, char* argv[], const char* pOption)
{
    for (int i = 1; i < argc; i++)
    {
        if ((argv[i][0] == '/') || (argv[i][0] == '-'))
        {
            if (crn_stricmp(&argv[i][1], pOption) == 0)
                return true;
        }
    }
    return false;
}